

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O0

CborError get_string_chunk_size(CborValue *it,size_t *offset,size_t *len)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  CborValue *in_RDI;
  long in_FS_OFFSET;
  uint64_t val;
  size_t bytesNeeded;
  uint8_t descriptor;
  size_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CborValue *in_stack_ffffffffffffffc8;
  CborError local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = cbor_value_is_length_known(in_RDI);
  if ((bVar2) && ((in_RDI->flags & 4) == 0)) {
    local_10 = CborErrorNoMoreStringChunks;
  }
  else {
    pvVar3 = read_bytes(in_stack_ffffffffffffffc8,
                        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,0x8d8cc5);
    if (pvVar3 == (void *)0x0) {
      local_10 = CborErrorUnexpectedEOF;
    }
    else if (in_RDI->type == 0xa0) {
      *in_RDX = 10;
      *in_RSI = 1;
      local_10 = CborNoError;
    }
    else {
      local_10 = CborErrorIllegalType;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static CborError get_string_chunk_size(const CborValue *it, size_t *offset, size_t *len)
{
    uint8_t descriptor;
    size_t bytesNeeded = 1;

    if (cbor_value_is_length_known(it) && (it->flags & CborIteratorFlag_BeforeFirstStringChunk) == 0)
        return CborErrorNoMoreStringChunks;

    /* are we at the end? */
    if (!read_bytes(it, &descriptor, 0, 1))
        return CborErrorUnexpectedEOF;

    if (descriptor == BreakByte)
        return CborErrorNoMoreStringChunks;
    if ((descriptor & MajorTypeMask) != it->type)
        return CborErrorIllegalType;

    /* find the string length */
    descriptor &= SmallValueMask;
    if (descriptor < Value8Bit) {
        *len = descriptor;
    } else if (unlikely(descriptor > Value64Bit)) {
        return CborErrorIllegalNumber;
    } else {
        uint64_t val;
        bytesNeeded = (size_t)(1 << (descriptor - Value8Bit));
        if (!can_read_bytes(it, 1 + bytesNeeded))
            return CborErrorUnexpectedEOF;

        if (descriptor <= Value16Bit) {
            if (descriptor == Value16Bit)
                val = read_uint16(it, 1);
            else
                val = read_uint8(it, 1);
        } else {
            if (descriptor == Value32Bit)
                val = read_uint32(it, 1);
            else
                val = read_uint64(it, 1);
        }

        *len = val;
        if (*len != val)
            return CborErrorDataTooLarge;

        ++bytesNeeded;
    }

    *offset = bytesNeeded;
    return CborNoError;
}